

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O2

int cm_zlib_gzclose_w(gzFile file)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -2;
  if ((file != (gzFile)0x0) && (file[1].have == 0x79b1)) {
    iVar2 = 0;
    if ((int)file[4].pos != 0) {
      *(undefined4 *)&file[4].pos = 0;
      iVar1 = gz_zero((gz_statep)file,(off_t)file[4].next);
      iVar2 = 0;
      if (iVar1 == -1) {
        iVar2 = *(int *)((long)&file[4].pos + 4);
      }
    }
    iVar1 = gz_comp((gz_statep)file,4);
    if (iVar1 == -1) {
      iVar2 = *(int *)((long)&file[4].pos + 4);
    }
    if ((int)file[1].pos != 0) {
      if ((int)file[2].pos == 0) {
        cm_zlib_deflateEnd((z_streamp)&file[5].next);
        free(file[2].next);
      }
      free(*(void **)(file + 2));
    }
    cm_zlib_gz_error((gz_statep)file,0,(char *)0x0);
    free(file[1].next);
    iVar1 = close(*(int *)&file[1].field_0x4);
    if (iVar1 == -1) {
      iVar2 = -1;
    }
    free(file);
  }
  return iVar2;
}

Assistant:

int ZEXPORT gzclose_w(gzFile file) {
    int ret = Z_OK;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;

    /* check that we're writing */
    if (state->mode != GZ_WRITE)
        return Z_STREAM_ERROR;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            ret = state->err;
    }

    /* flush, free memory, and close file */
    if (gz_comp(state, Z_FINISH) == -1)
        ret = state->err;
    if (state->size) {
        if (!state->direct) {
            (void)deflateEnd(&(state->strm));
            free(state->out);
        }
        free(state->in);
    }
    gz_error(state, Z_OK, NULL);
    free(state->path);
    if (close(state->fd) == -1)
        ret = Z_ERRNO;
    free(state);
    return ret;
}